

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_write_u8(mpack_writer_t *writer,uint8_t value)

{
  _Bool _Var1;
  size_t sVar2;
  uint8_t value_local;
  mpack_writer_t *writer_local;
  
  mpack_writer_track_element(writer);
  if (value < 0x80) {
    sVar2 = mpack_writer_buffer_left(writer);
    if ((sVar2 != 0) || (_Var1 = mpack_writer_ensure(writer,1), _Var1)) {
      mpack_encode_fixuint(writer->current,value);
      writer->current = writer->current + 1;
    }
  }
  else {
    sVar2 = mpack_writer_buffer_left(writer);
    if ((1 < sVar2) || (_Var1 = mpack_writer_ensure(writer,2), _Var1)) {
      mpack_encode_u8(writer->current,value);
      writer->current = writer->current + 2;
    }
  }
  return;
}

Assistant:

void mpack_write_u8(mpack_writer_t* writer, uint8_t value) {
    #if MPACK_OPTIMIZE_FOR_SIZE
    mpack_write_u64(writer, value);
    #else
    mpack_writer_track_element(writer);
    if (value <= 127) {
        MPACK_WRITE_ENCODED(mpack_encode_fixuint, MPACK_TAG_SIZE_FIXUINT, value);
    } else {
        MPACK_WRITE_ENCODED(mpack_encode_u8, MPACK_TAG_SIZE_U8, value);
    }
    #endif
}